

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O0

DdNode * cuddConstantLookup(DdManager *table,ptruint op,DdNode *f,DdNode *g,DdNode *h)

{
  DdCache *pDVar1;
  ptruint uhc;
  ptruint ugc;
  ptruint ufc;
  ptruint uh;
  ptruint ug;
  ptruint uf;
  DdCache *cache;
  DdCache *en;
  int posn;
  DdNode *h_local;
  DdNode *g_local;
  DdNode *f_local;
  ptruint op_local;
  DdManager *table_local;
  
  pDVar1 = table->cache +
           (int)(((((uint)(*(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) << 1) | (uint)f & 1 |
                   (uint)op & 0xe) +
                  ((uint)(*(long *)(((ulong)h & 0xfffffffffffffffe) + 0x20) << 1) | (uint)h & 1)) *
                  0xc00005 +
                 ((uint)(*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1) | (uint)g & 1 |
                 (uint)(op >> 4))) * 0x40f1f9 >> ((byte)table->cacheShift & 0x1f));
  if ((((pDVar1->data == (DdNode *)0x0) || (pDVar1->f != (DdNode *)((ulong)f | op & 0xe))) ||
      (pDVar1->g != (DdNode *)((ulong)g | op >> 4))) || ((DdNode *)pDVar1->h != h)) {
    table->cacheMisses = table->cacheMisses + 1.0;
    if ((-1 < table->cacheSlack) && (table->cacheMisses * table->minHit < table->cacheHits)) {
      cuddCacheResize(table);
    }
    table_local = (DdManager *)0x0;
  }
  else {
    table->cacheHits = table->cacheHits + 1.0;
    table_local = (DdManager *)pDVar1->data;
  }
  return &table_local->sentinel;
}

Assistant:

DdNode *
cuddConstantLookup(
  DdManager * table,
  ptruint op,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    int posn;
    DdCache *en,*cache;
    ptruint uf, ug, uh;
    ptruint ufc, ugc, uhc;

    uf = (ptruint) f | (op & 0xe);
    ug = (ptruint) g | (op >> 4);
    uh = (ptruint) h;

    ufc = (ptruint) cuddF2L(f) | (op & 0xe);
    ugc = (ptruint) cuddF2L(g) | (op >> 4);
    uhc = (ptruint) cuddF2L(h);

    cache = table->cache;
#ifdef DD_DEBUG
    if (cache == NULL) {
        return(NULL);
    }
#endif
    posn = ddCHash2(uhc,ufc,ugc,table->cacheShift);
    en = &cache[posn];

    /* We do not reclaim here because the result should not be
     * referenced, but only tested for being a constant.
     */
    if (en->data != NULL &&
        en->f == (DdNodePtr)uf && en->g == (DdNodePtr)ug && en->h == uh) {
        table->cacheHits++;
        return(en->data);
    }

    /* Cache miss: decide whether to resize. */
    table->cacheMisses++;

    if (table->cacheSlack >= 0 &&
        table->cacheHits > table->cacheMisses * table->minHit) {
        cuddCacheResize(table);
    }

    return(NULL);

}